

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AssertionInstanceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Symbol *args_1,AssertionExpr *args_2,bool *args_3,
          SourceRange *args_4)

{
  bool bVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  AssertionInstanceExpression *pAVar4;
  
  pAVar4 = (AssertionInstanceExpression *)allocate(this,0x68,8);
  bVar1 = *args_3;
  SVar2 = args_4->startLoc;
  SVar3 = args_4->endLoc;
  (pAVar4->super_Expression).kind = AssertionInstance;
  (pAVar4->super_Expression).type.ptr = args;
  (pAVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pAVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pAVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pAVar4->super_Expression).sourceRange.endLoc = SVar3;
  pAVar4->symbol = args_1;
  pAVar4->body = args_2;
  (pAVar4->arguments)._M_ptr = (pointer)0x0;
  (pAVar4->arguments)._M_extent._M_extent_value = 0;
  (pAVar4->localVars)._M_ptr = (pointer)0x0;
  (pAVar4->localVars)._M_extent._M_extent_value = 0;
  pAVar4->isRecursiveProperty = bVar1;
  return pAVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }